

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_decode_psb(pt_event_decoder *decoder)

{
  int iVar1;
  pt_event *ppVar2;
  pt_event *ppVar3;
  pt_event *head;
  int errcode;
  pt_event *ev;
  pt_packet *packet;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    iVar1 = pt_evq_pending(&decoder->evq,0xffffffff);
    if (iVar1 == 0) {
      pt_last_ip_init(&decoder->ip);
      decoder->field_0x72c = decoder->field_0x72c & 0xef;
      ppVar2 = pt_evq_enqueue(&decoder->evq,1);
      if (ppVar2 == (pt_event *)0x0) {
        decoder_local._4_4_ = -9;
      }
      else {
        ppVar2->field_0x4 = ppVar2->field_0x4 & 0xfd | 2;
        do {
          head._4_4_ = pt_evt_fetch_packet(decoder);
          if (head._4_4_ < 0) {
            return head._4_4_;
          }
          switch((decoder->packet).type) {
          case ppt_invalid:
            head._4_4_ = decoder->status;
            break;
          default:
            head._4_4_ = -6;
            break;
          case ppt_pad:
            break;
          case ppt_psbend:
            if (((byte)decoder->field_0x72c >> 4 & 1) == 0) {
              ppVar2->type = ptev_disabled;
              ppVar2->field_0x4 = ppVar2->field_0x4 & 0xfe | 1;
            }
            else {
              ppVar2->type = ptev_enabled;
            }
            return 1;
          case ppt_fup:
            head._4_4_ = pt_evt_header_fup(decoder,&(decoder->packet).payload.ip);
            break;
          case ppt_mode:
            head._4_4_ = pt_evt_header_mode(decoder,&(decoder->packet).payload.mode);
            break;
          case ppt_pip:
            head._4_4_ = pt_evt_header_pip(decoder,&(decoder->packet).payload.pip);
            break;
          case ppt_vmcs:
            head._4_4_ = pt_evt_header_vmcs(decoder,&(decoder->packet).payload.vmcs);
            break;
          case ppt_cbr:
            head._4_4_ = pt_evt_header_cbr(decoder,&(decoder->packet).payload.cbr);
            break;
          case ppt_tsc:
            head._4_4_ = pt_evt_header_tsc(decoder,&(decoder->packet).payload.tsc);
            break;
          case ppt_tma:
            head._4_4_ = pt_evt_header_tma(decoder,&(decoder->packet).payload.tma);
            break;
          case ppt_mtc:
            head._4_4_ = pt_evt_header_mtc(decoder,&(decoder->packet).payload.mtc);
            break;
          case ppt_cyc:
            head._4_4_ = pt_evt_header_cyc(decoder,&(decoder->packet).payload.cyc);
            break;
          case ppt_ovf:
            if (((byte)decoder->field_0x72c >> 4 & 1) == 0) {
              ppVar3 = pt_evq_dequeue(&decoder->evq,1);
              if (ppVar3 != ppVar2) {
                return -1;
              }
            }
            else {
              ppVar2->type = ptev_enabled;
            }
            return 1;
          case ppt_mnt:
            head._4_4_ = pt_evt_header_mnt(decoder,&(decoder->packet).payload.mnt);
          }
        } while (-1 < head._4_4_);
        decoder_local._4_4_ = head._4_4_;
      }
    }
    else {
      decoder_local._4_4_ = -6;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static int pt_evt_decode_psb(struct pt_event_decoder *decoder)
{
	const struct pt_packet *packet;
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	/* We must not carry partial events across PSB. */
	if (pt_evq_pending(&decoder->evq, UINT32_MAX))
		return -pte_bad_context;

	pt_last_ip_init(&decoder->ip);
	decoder->enabled = 0;

	/* Create an event that will represent the enabled/disabled status.
	 *
	 * We do not know the status, yet, but we want the event to be first.
	 * We will fill in the details when we reach PSBEND.
	 */
	ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
	if (!ev)
		return -pte_nomem;

	ev->status_update = 1;

	packet = &decoder->packet;
	for (;;) {
		errcode = pt_evt_fetch_packet(decoder);
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			errcode = pt_evt_header_fup(decoder,
						    &packet->payload.ip);
			break;

		case ppt_mode:
			errcode = pt_evt_header_mode(decoder,
						     &packet->payload.mode);
			break;

		case ppt_pip:
			errcode = pt_evt_header_pip(decoder,
						    &packet->payload.pip);
			break;

		case ppt_vmcs:
			errcode = pt_evt_header_vmcs(decoder,
						     &packet->payload.vmcs);
			break;

		case ppt_mnt:
			errcode = pt_evt_header_mnt(decoder,
						    &packet->payload.mnt);
			break;

		case ppt_tsc:
			errcode = pt_evt_header_tsc(decoder,
						    &packet->payload.tsc);
			break;

		case ppt_cbr:
			errcode = pt_evt_header_cbr(decoder,
						    &packet->payload.cbr);
			break;

		case ppt_tma:
			errcode = pt_evt_header_tma(decoder,
						    &packet->payload.tma);
			break;

		case ppt_mtc:
			errcode = pt_evt_header_mtc(decoder,
						    &packet->payload.mtc);
			break;

		case ppt_cyc:
			errcode = pt_evt_header_cyc(decoder,
						    &packet->payload.cyc);
			break;

		case ppt_psbend:
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				ev->type = ptev_disabled;
				ev->ip_suppressed = 1;
			}

			return 1;

		case ppt_ovf: {
			/* When PSB+ ends with an OVF, we remove the event we
			 * created initially if tracing is not enabled.
			 *
			 * We may have lost the FUP and end up with an invalid
			 * status update that might be diagnosed before we
			 * reach the overflow event.
			 */
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				const struct pt_event *head;

				head = pt_evq_dequeue(&decoder->evq,
						      evb_psbend);
				if (head != ev)
					return -pte_internal;
			}

			return 1;
		}

		case ppt_pad:
			break;

		case ppt_invalid:
			errcode = decoder->status;
			break;

		default:
			errcode = -pte_bad_context;
			break;
		}

		if (errcode < 0)
			return errcode;
	}
}